

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock_updates.cc
# Opt level: O0

void __thiscall
tchecker::clock_update_t::clock_update_t
          (clock_update_t *this,clock_id_t clock_id,shared_ptr<const_tchecker::expression_t> *value)

{
  bool bVar1;
  invalid_argument *this_00;
  shared_ptr<const_tchecker::expression_t> *value_local;
  clock_id_t clock_id_local;
  clock_update_t *this_local;
  
  this->_clock_id = clock_id;
  std::shared_ptr<const_tchecker::expression_t>::shared_ptr(&this->_value,value);
  bVar1 = std::operator==(&this->_value,(nullptr_t)0x0);
  if (!bVar1) {
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Unexpected nullptr value");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

clock_update_t::clock_update_t(tchecker::clock_id_t clock_id, std::shared_ptr<tchecker::expression_t const> const & value)
    : _clock_id(clock_id), _value(value)
{
  if (_value == nullptr)
    throw std::invalid_argument("Unexpected nullptr value");
}